

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PretransformVertices.cpp
# Opt level: O1

void __thiscall
Assimp::PretransformVertices::ApplyTransform
          (PretransformVertices *this,aiMesh *mesh,aiMatrix4x4 *mat)

{
  float fVar1;
  float fVar2;
  uint uVar3;
  aiVector3D *paVar4;
  long lVar5;
  ulong uVar6;
  bool bVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float local_84;
  
  fVar8 = mat->a2;
  if (((((((0.01 < ABS(fVar8)) || (0.01 < ABS(mat->a3))) || (0.01 < ABS(mat->a4))) ||
        (((0.01 < ABS(mat->b1) || (0.01 < ABS(mat->b3))) ||
         ((0.01 < ABS(mat->b4) || ((0.01 < ABS(mat->c1) || (0.01 < ABS(mat->c2))))))))) ||
       (0.01 < ABS(mat->c4))) ||
      ((((0.01 < ABS(mat->d1) || (0.01 < ABS(mat->d2))) || (0.01 < ABS(mat->d3))) ||
       (((1.01 < mat->a1 || (mat->a1 < 0.99)) ||
        (((1.01 < mat->b2 || ((mat->b2 < 0.99 || (1.01 < mat->c3)))) || (mat->c3 < 0.99)))))))) ||
     ((1.01 < mat->d4 || (mat->d4 < 0.99)))) {
    if ((mesh->mFaces != (aiFace *)0x0) && (mesh->mNumFaces != 0)) {
      fVar15 = mat->b2;
      fVar19 = mat->a1;
      fVar9 = mat->a3;
      fVar20 = mat->c3;
      fVar1 = mat->d4;
      fVar10 = mat->c4;
      fVar17 = mat->d3;
      fVar11 = mat->b3;
      fVar16 = mat->d2;
      fVar14 = mat->c2;
      fVar13 = mat->b4;
      fVar12 = mat->d1;
      fVar18 = mat->c1;
      fVar21 = mat->b1;
      fVar2 = mat->a4;
      if (fVar11 * fVar2 * fVar14 * fVar12 +
          ((fVar15 * fVar2 * fVar18 * fVar17 +
           ((fVar21 * fVar2 * fVar20 * fVar16 +
            (((fVar10 * fVar9 * fVar15 * fVar12 +
              ((fVar14 * fVar21 * fVar9 * fVar1 +
               ((fVar18 * fVar13 * fVar9 * fVar16 +
                fVar8 * fVar21 * fVar10 * fVar17 +
                ((fVar8 * fVar13 * fVar20 * fVar12 +
                 ((fVar8 * fVar11 * fVar18 * fVar1 +
                  (((fVar14 * fVar19 * fVar13 * fVar17 +
                    ((fVar10 * fVar19 * fVar11 * fVar16 +
                     (fVar19 * fVar15 * fVar20 * fVar1 - fVar10 * fVar19 * fVar15 * fVar17)) -
                    fVar19 * fVar11 * fVar14 * fVar1)) - fVar19 * fVar13 * fVar20 * fVar16) -
                  fVar10 * fVar8 * fVar11 * fVar12)) - fVar18 * fVar8 * fVar13 * fVar17)) -
                fVar20 * fVar8 * fVar21 * fVar1)) - fVar13 * fVar9 * fVar14 * fVar12)) -
              fVar21 * fVar9 * fVar10 * fVar16)) - fVar9 * fVar15 * fVar18 * fVar1) -
            fVar14 * fVar21 * fVar2 * fVar17)) - fVar20 * fVar15 * fVar2 * fVar12)) -
          fVar18 * fVar11 * fVar2 * fVar16) < 0.0) {
        FlipWindingOrderProcess::ProcessMesh(mesh);
      }
    }
    if (((mesh->mVertices != (aiVector3D *)0x0) && (mesh->mNumVertices != 0)) &&
       (mesh->mNumVertices != 0)) {
      lVar5 = 8;
      uVar6 = 0;
      do {
        paVar4 = mesh->mVertices;
        fVar8 = *(float *)((long)paVar4 + lVar5 + -8);
        fVar15 = *(float *)((long)paVar4 + lVar5 + -4);
        fVar19 = *(float *)((long)&paVar4->x + lVar5);
        fVar9 = mat->c2;
        fVar20 = mat->c1;
        fVar1 = mat->c3;
        fVar10 = mat->c4;
        *(ulong *)((long)paVar4 + lVar5 + -8) =
             CONCAT44(mat->b3 * fVar19 + mat->b1 * fVar8 + mat->b2 * fVar15 + mat->b4,
                      mat->a3 * fVar19 + mat->a1 * fVar8 + mat->a2 * fVar15 + mat->a4);
        *(float *)((long)&paVar4->x + lVar5) =
             fVar19 * fVar1 + fVar8 * fVar20 + fVar15 * fVar9 + fVar10;
        uVar6 = uVar6 + 1;
        lVar5 = lVar5 + 0xc;
      } while (uVar6 < mesh->mNumVertices);
    }
    bVar7 = mesh->mNormals != (aiVector3D *)0x0;
    uVar3 = mesh->mNumVertices;
    if ((uVar3 != 0 && bVar7) ||
       ((mesh->mBitangents != (aiVector3D *)0x0 && mesh->mTangents != (aiVector3D *)0x0) &&
        uVar3 != 0)) {
      fVar8 = mat->a1;
      fVar15 = mat->a2;
      fVar19 = mat->b1;
      fVar9 = mat->b2;
      fVar20 = mat->b3;
      fVar1 = mat->c1;
      fVar10 = mat->c2;
      fVar17 = mat->c3;
      fVar11 = fVar19 * -fVar15;
      fVar14 = -mat->a3;
      fVar16 = fVar9 * fVar14 * fVar1 +
               mat->a3 * fVar19 * fVar10 +
               fVar11 * fVar17 +
               fVar15 * fVar20 * fVar1 + (fVar8 * fVar9 * fVar17 - fVar20 * fVar8 * fVar10);
      if ((fVar16 != 0.0) || (NAN(fVar16))) {
        fVar16 = 1.0 / fVar16;
        fVar13 = -fVar16;
        fVar18 = (fVar15 * fVar17 + fVar10 * fVar14) * fVar13;
        local_84 = (fVar19 * fVar17 - fVar20 * fVar1) * fVar13;
        fVar21 = (fVar20 * fVar8 + fVar14 * fVar19) * fVar13;
        fVar13 = (fVar8 * fVar10 + -fVar15 * fVar1) * fVar13;
        fVar12 = (fVar9 * fVar17 - fVar10 * fVar20) * fVar16;
        fVar15 = (fVar15 * fVar20 + fVar9 * fVar14) * fVar16;
        fVar20 = (fVar17 * fVar8 + fVar1 * fVar14) * fVar16;
        fVar19 = (fVar19 * fVar10 - fVar9 * fVar1) * fVar16;
        fVar16 = (fVar8 * fVar9 + fVar11) * fVar16;
      }
      else {
        fVar12 = NAN;
        fVar18 = NAN;
        fVar15 = NAN;
        local_84 = NAN;
        fVar20 = NAN;
        fVar21 = NAN;
        fVar19 = NAN;
        fVar13 = NAN;
        fVar16 = NAN;
      }
      if ((uVar3 != 0 && bVar7) && (mesh->mNumVertices != 0)) {
        lVar5 = 8;
        uVar6 = 0;
        do {
          paVar4 = mesh->mNormals;
          fVar8 = *(float *)((long)paVar4 + lVar5 + -8);
          fVar9 = *(float *)((long)paVar4 + lVar5 + -4);
          fVar1 = *(float *)((long)&paVar4->x + lVar5);
          fVar17 = fVar19 * fVar1 + fVar12 * fVar8 + local_84 * fVar9;
          fVar10 = fVar13 * fVar1 + fVar18 * fVar8 + fVar20 * fVar9;
          fVar8 = fVar1 * fVar16 + fVar8 * fVar15 + fVar9 * fVar21;
          fVar9 = fVar8 * fVar8 + fVar17 * fVar17 + fVar10 * fVar10;
          if (fVar9 < 0.0) {
            fVar9 = sqrtf(fVar9);
          }
          else {
            fVar9 = SQRT(fVar9);
          }
          fVar9 = 1.0 / fVar9;
          paVar4 = mesh->mNormals;
          *(ulong *)((long)paVar4 + lVar5 + -8) = CONCAT44(fVar10 * fVar9,fVar17 * fVar9);
          *(float *)((long)&paVar4->x + lVar5) = fVar9 * fVar8;
          uVar6 = uVar6 + 1;
          lVar5 = lVar5 + 0xc;
        } while (uVar6 < mesh->mNumVertices);
      }
      if ((((mesh->mTangents != (aiVector3D *)0x0) && (mesh->mBitangents != (aiVector3D *)0x0)) &&
          (mesh->mNumVertices != 0)) && (mesh->mNumVertices != 0)) {
        lVar5 = 8;
        uVar6 = 0;
        do {
          paVar4 = mesh->mTangents;
          fVar8 = *(float *)((long)paVar4 + lVar5 + -8);
          fVar9 = *(float *)((long)paVar4 + lVar5 + -4);
          fVar1 = *(float *)((long)&paVar4->x + lVar5);
          fVar17 = fVar19 * fVar1 + fVar12 * fVar8 + local_84 * fVar9;
          fVar10 = fVar13 * fVar1 + fVar18 * fVar8 + fVar20 * fVar9;
          fVar9 = fVar1 * fVar16 + fVar8 * fVar15 + fVar9 * fVar21;
          fVar8 = fVar9 * fVar9 + fVar17 * fVar17 + fVar10 * fVar10;
          if (fVar8 < 0.0) {
            fVar8 = sqrtf(fVar8);
          }
          else {
            fVar8 = SQRT(fVar8);
          }
          fVar8 = 1.0 / fVar8;
          paVar4 = mesh->mTangents;
          *(ulong *)((long)paVar4 + lVar5 + -8) = CONCAT44(fVar10 * fVar8,fVar17 * fVar8);
          *(float *)((long)&paVar4->x + lVar5) = fVar8 * fVar9;
          paVar4 = mesh->mBitangents;
          fVar8 = *(float *)((long)paVar4 + lVar5 + -8);
          fVar9 = *(float *)((long)paVar4 + lVar5 + -4);
          fVar1 = *(float *)((long)&paVar4->x + lVar5);
          fVar17 = fVar19 * fVar1 + fVar12 * fVar8 + local_84 * fVar9;
          fVar10 = fVar13 * fVar1 + fVar18 * fVar8 + fVar20 * fVar9;
          fVar9 = fVar1 * fVar16 + fVar8 * fVar15 + fVar9 * fVar21;
          fVar8 = fVar9 * fVar9 + fVar17 * fVar17 + fVar10 * fVar10;
          if (fVar8 < 0.0) {
            fVar8 = sqrtf(fVar8);
          }
          else {
            fVar8 = SQRT(fVar8);
          }
          fVar8 = 1.0 / fVar8;
          paVar4 = mesh->mBitangents;
          *(ulong *)((long)paVar4 + lVar5 + -8) = CONCAT44(fVar10 * fVar8,fVar17 * fVar8);
          *(float *)((long)&paVar4->x + lVar5) = fVar8 * fVar9;
          uVar6 = uVar6 + 1;
          lVar5 = lVar5 + 0xc;
        } while (uVar6 < mesh->mNumVertices);
      }
    }
  }
  return;
}

Assistant:

void PretransformVertices::ApplyTransform(aiMesh *mesh, const aiMatrix4x4 &mat) const {
	// Check whether we need to transform the coordinates at all
	if (!mat.IsIdentity()) {

		// Check for odd negative scale (mirror)
		if (mesh->HasFaces() && mat.Determinant() < 0) {
			// Reverse the mesh face winding order
			FlipWindingOrderProcess::ProcessMesh(mesh);
		}

		// Update positions
		if (mesh->HasPositions()) {
			for (unsigned int i = 0; i < mesh->mNumVertices; ++i) {
				mesh->mVertices[i] = mat * mesh->mVertices[i];
			}
		}

		// Update normals and tangents
		if (mesh->HasNormals() || mesh->HasTangentsAndBitangents()) {
			const aiMatrix3x3 m = aiMatrix3x3(mat).Inverse().Transpose();

			if (mesh->HasNormals()) {
				for (unsigned int i = 0; i < mesh->mNumVertices; ++i) {
					mesh->mNormals[i] = (m * mesh->mNormals[i]).Normalize();
				}
			}
			if (mesh->HasTangentsAndBitangents()) {
				for (unsigned int i = 0; i < mesh->mNumVertices; ++i) {
					mesh->mTangents[i] = (m * mesh->mTangents[i]).Normalize();
					mesh->mBitangents[i] = (m * mesh->mBitangents[i]).Normalize();
				}
			}
		}
	}
}